

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

string * lest::not_expr(text *message)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  string *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50 [32];
  string local_30 [32];
  
  __lhs = local_50;
  __rhs = in_RDI;
  std::operator+((char *)in_RDI,in_RSI);
  std::operator+(__lhs,(char *)__rhs);
  std::__cxx11::string::string(in_RDI,local_30);
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::~string((string *)local_50);
  return __rhs;
}

Assistant:

inline text not_expr( text message )
{
    return "! ( " + message + " )";
}